

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

bool __thiscall Catch::TestCase::operator==(TestCase *this,TestCase *other)

{
  __type _Var1;
  
  if ((this->test).m_p == (other->test).m_p) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)other);
    if (_Var1) {
      _Var1 = std::operator==(&(this->super_TestCaseInfo).className,
                              &(other->super_TestCaseInfo).className);
      return _Var1;
    }
  }
  return false;
}

Assistant:

const T* get() const{ return m_p; }